

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O1

bool __thiscall
perfetto::protos::gen::EnableTracingRequest::ParseFromArray
          (EnableTracingRequest *this,void *raw,size_t size)

{
  byte bVar1;
  _Head_base<0UL,_perfetto::protos::gen::TraceConfig_*,_false> _Var2;
  ulong uVar3;
  ulong uVar4;
  ushort uVar5;
  long lVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *dst;
  bool bVar7;
  uint uVar8;
  ulong *puVar9;
  ulong uVar10;
  ulong *puVar11;
  ulong *puVar12;
  ulong uVar13;
  ulong uVar14;
  uint uVar15;
  uint *puVar16;
  ulong *puVar17;
  bool bVar18;
  ulong local_58;
  Field local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_40;
  ulong *local_38;
  
  dst = &this->unknown_fields_;
  (this->unknown_fields_)._M_string_length = 0;
  *(this->unknown_fields_)._M_dataplus._M_p = '\0';
  puVar17 = (ulong *)(size + (long)raw);
  do {
    lVar6 = 7;
    if (puVar17 <= raw) goto LAB_0026ec04;
    uVar10 = (ulong)(char)(byte)*raw;
    puVar9 = (ulong *)((long)raw + 1);
    if ((long)uVar10 < 0) {
      bVar1 = (byte)*raw;
      uVar3 = (ulong)(bVar1 & 0x7f);
      bVar7 = false;
      puVar11 = puVar9;
      for (; (uVar10 = uVar3, puVar12 = puVar11, (char)bVar1 < '\0' &&
             (bVar18 = 0x38 < lVar6 - 7U, bVar7 = bVar18 || puVar17 <= puVar11,
             size = (size_t)puVar11, uVar10 = 0, puVar12 = puVar9, !bVar18 && puVar17 > puVar11));
          lVar6 = lVar6 + 7) {
        bVar1 = (byte)*puVar11;
        puVar11 = (ulong *)((long)puVar11 + 1);
        uVar3 = uVar3 | (ulong)(bVar1 & 0x7f) << ((byte)lVar6 & 0x3f);
        size = (size_t)puVar11;
      }
      puVar9 = puVar12;
      if (bVar7) {
        puVar9 = (ulong *)raw;
        uVar10 = 0;
      }
      if (puVar9 == (ulong *)raw) goto LAB_0026ec04;
    }
    uVar8 = (uint)(uVar10 >> 3);
    if ((uVar8 == 0) || (puVar17 <= puVar9)) {
switchD_0026ea6a_caseD_3:
      bVar7 = false;
      uVar10 = 0;
      local_50.int_value_ = 0;
    }
    else {
      switch((uint)uVar10 & 7) {
      case 0:
        uVar13 = 0;
        bVar7 = puVar9 >= puVar17;
        if (puVar9 < puVar17) {
          size = (long)puVar9 + 1;
          uVar3 = (ulong)((byte)*puVar9 & 0x7f);
          uVar4 = uVar3;
          uVar15 = 0;
          if ((char)(byte)*puVar9 < '\0') {
            uVar4 = 0;
            uVar15 = 0;
            lVar6 = 7;
            puVar11 = (ulong *)size;
            do {
              bVar18 = 0x38 < lVar6 - 7U;
              bVar7 = bVar18 || puVar17 <= puVar11;
              if (bVar18 || puVar17 <= puVar11) goto LAB_0026ec0b;
              uVar14 = *puVar11;
              puVar11 = (ulong *)((long)puVar11 + 1);
              uVar3 = uVar3 | (ulong)((byte)uVar14 & 0x7f) << ((byte)lVar6 & 0x3f);
              lVar6 = lVar6 + 7;
            } while ((char)(byte)uVar14 < '\0');
            uVar4 = uVar3 & 0xffffffff;
            size = (size_t)puVar11;
            uVar15 = (uint)(uVar3 >> 0x20);
          }
        }
        else {
          uVar4 = 0;
          uVar15 = 0;
        }
LAB_0026ec0b:
        uVar3 = (ulong)uVar15;
        if (bVar7) {
          size = (size_t)puVar9;
          uVar3 = uVar13;
          uVar4 = uVar13;
        }
        local_38 = (ulong *)raw;
        if ((ulong *)size != puVar9) goto LAB_0026ec37;
        uVar10 = 0;
        bVar7 = false;
        local_50.int_value_ = uVar13;
        goto LAB_0026ec79;
      case 1:
        size = (size_t)(puVar9 + 1);
        if (puVar17 < size) {
LAB_0026ec04:
          uVar10 = 0;
          bVar7 = false;
          local_50.int_value_ = 0;
          goto LAB_0026ec79;
        }
        uVar4 = *puVar9;
        uVar3 = uVar4 >> 0x20;
        break;
      case 2:
        bVar7 = puVar9 >= puVar17;
        uVar4 = local_58;
        if (puVar9 < puVar17) {
          puVar11 = (ulong *)((long)puVar9 + 1);
          uVar3 = (ulong)((byte)*puVar9 & 0x7f);
          size = (size_t)puVar11;
          uVar4 = uVar3;
          if ((char)(byte)*puVar9 < '\0') {
            lVar6 = 7;
            puVar12 = puVar11;
            do {
              bVar7 = 0x38 < lVar6 - 7U || puVar17 <= puVar12;
              size = (size_t)puVar11;
              uVar4 = local_58;
              if (bVar7) break;
              uVar13 = *puVar12;
              size = (long)puVar12 + 1;
              uVar3 = uVar3 | (ulong)((byte)uVar13 & 0x7f) << ((byte)lVar6 & 0x3f);
              lVar6 = lVar6 + 7;
              puVar12 = (ulong *)size;
              uVar4 = uVar3;
            } while ((char)(byte)uVar13 < '\0');
          }
        }
        uVar3 = 0;
        local_58 = uVar4;
        if (bVar7) {
          size = (size_t)puVar9;
          local_58 = uVar3;
        }
        if ((ulong *)size == puVar9) {
          uVar4 = 0;
          bVar7 = false;
          uVar13 = 0;
        }
        else if ((long)puVar17 - size < local_58) {
          uVar3 = 0;
          uVar4 = 0;
          bVar7 = false;
          uVar13 = 0;
        }
        else {
          uVar3 = size >> 0x20;
          uVar4 = size & 0xffffffff;
          size = size + local_58;
          bVar7 = true;
          uVar13 = local_58;
        }
        if (!bVar7) goto LAB_0026ec04;
        goto LAB_0026ec37;
      default:
        goto switchD_0026ea6a_caseD_3;
      case 5:
        size = (long)puVar9 + 4;
        uVar3 = 0;
        if (puVar17 < size) goto LAB_0026ec04;
        uVar4 = (ulong)(uint)*puVar9;
      }
      uVar13 = 0;
LAB_0026ec37:
      bVar7 = true;
      raw = (void *)size;
      if ((uVar8 < 0x10000) && (uVar13 < 0x10000000)) {
        local_50.int_value_ = uVar4 & 0xffffffff | uVar3 << 0x20;
        uVar10 = uVar13 | (uVar10 >> 3) << 0x20 | (ulong)((uint)uVar10 & 7) << 0x30;
        bVar7 = false;
      }
      else {
        local_50.int_value_ = 0;
        uVar10 = 0;
      }
    }
LAB_0026ec79:
    puVar16 = &switchD_0026ea6a::switchdataD_0034f560;
    if (!bVar7) {
      local_50.size_ = (uint32_t)uVar10;
      local_50.type_ = (uint8_t)(uVar10 >> 0x30);
      local_50.id_ = (uint16_t)(uVar10 >> 0x20);
      local_40 = dst;
      uVar3 = local_50.int_value_;
      do {
        if (local_50.id_ == 0) {
          return puVar17 == (ulong *)raw;
        }
        uVar5 = (ushort)(uVar10 >> 0x20);
        if (uVar5 < 3) {
          (this->_has_field_).super__Base_bitset<1UL>._M_w =
               (this->_has_field_).super__Base_bitset<1UL>._M_w |
               1L << ((byte)(uVar10 >> 0x20) & 0x3f);
        }
        if (uVar5 == 2) {
          this->attach_notification_only_ = local_50.int_value_ != 0;
        }
        else if (((uint)(uVar10 >> 0x20) & 0xffff) == 1) {
          _Var2._M_head_impl =
               (this->trace_config_).ptr_._M_t.
               super___uniq_ptr_impl<perfetto::protos::gen::TraceConfig,_std::default_delete<perfetto::protos::gen::TraceConfig>_>
               ._M_t.
               super__Tuple_impl<0UL,_perfetto::protos::gen::TraceConfig_*,_std::default_delete<perfetto::protos::gen::TraceConfig>_>
               .super__Head_base<0UL,_perfetto::protos::gen::TraceConfig_*,_false>._M_head_impl;
          (**(code **)(*(long *)&(_Var2._M_head_impl)->super_CppMessageObj + 0x20))
                    (_Var2._M_head_impl,local_50.int_value_,local_50.size_);
        }
        else {
          protozero::Field::SerializeAndAppendToInternal<std::__cxx11::string>(&local_50,dst);
        }
        do {
          if (puVar17 <= raw) goto LAB_0026ee35;
          uVar10 = (ulong)(char)(byte)*raw;
          puVar9 = (ulong *)((long)raw + 1);
          if ((long)uVar10 < 0) {
            uVar4 = (ulong)((byte)*raw & 0x7f);
            bVar7 = false;
            uVar10 = uVar4;
            puVar11 = puVar9;
            if ((char)(byte)*raw < '\0') {
              lVar6 = 7;
              puVar12 = puVar9;
              do {
                bVar7 = 0x38 < lVar6 - 7U || puVar17 <= puVar12;
                uVar10 = 0;
                puVar11 = puVar9;
                if (bVar7) break;
                uVar13 = *puVar12;
                puVar11 = (ulong *)((long)puVar12 + 1);
                uVar4 = uVar4 | (ulong)((byte)uVar13 & 0x7f) << ((byte)lVar6 & 0x3f);
                lVar6 = lVar6 + 7;
                uVar10 = uVar4;
                puVar12 = puVar11;
              } while ((char)(byte)uVar13 < '\0');
            }
            puVar9 = puVar11;
            if (bVar7) {
              puVar9 = (ulong *)raw;
              uVar10 = 0;
            }
            if (puVar9 == (ulong *)raw) goto LAB_0026ee35;
          }
          uVar8 = (uint)(uVar10 >> 3);
          if ((uVar8 == 0) || (puVar17 <= puVar9)) {
switchD_0026eebd_caseD_3:
            local_50.int_value_ = 0;
            bVar7 = false;
            uVar10 = 0;
            goto LAB_0026f0bf;
          }
          switch((uint)uVar10 & 7) {
          case 0:
            local_50.int_value_ = 0;
            bVar7 = puVar9 >= puVar17;
            if (puVar9 < puVar17) {
              puVar11 = (ulong *)((long)puVar9 + 1);
              uVar15 = (byte)*puVar9 & 0x7f;
              uVar4 = (ulong)uVar15;
              uVar13 = (ulong)uVar15;
              puVar16 = (uint *)puVar11;
              uVar15 = 0;
              if ((char)(byte)*puVar9 < '\0') {
                uVar13 = 0;
                lVar6 = 7;
                puVar12 = puVar11;
                do {
                  bVar18 = 0x38 < lVar6 - 7U;
                  bVar7 = bVar18 || puVar17 <= puVar12;
                  puVar16 = (uint *)puVar11;
                  uVar15 = 0;
                  if (bVar18 || puVar17 <= puVar12) break;
                  bVar1 = (byte)*puVar12;
                  puVar12 = (ulong *)((long)puVar12 + 1);
                  uVar4 = uVar4 | (ulong)(bVar1 & 0x7f) << ((byte)lVar6 & 0x3f);
                  lVar6 = lVar6 + 7;
                  if (-1 < (char)bVar1) {
                    uVar13 = uVar4 & 0xffffffff;
                  }
                  puVar16 = (uint *)puVar12;
                  uVar15 = (uint)(uVar4 >> 0x20);
                } while (-1 >= (char)bVar1);
              }
            }
            else {
              uVar13 = 0;
              uVar15 = 0;
            }
            if (bVar7) {
              uVar13 = local_50.int_value_;
            }
            uVar4 = (ulong)uVar15;
            if (bVar7) {
              puVar16 = (uint *)puVar9;
              uVar4 = local_50.int_value_;
            }
            dst = local_40;
            uVar14 = local_50.int_value_;
            local_38 = (ulong *)raw;
            if ((ulong *)puVar16 == puVar9) {
              uVar10 = 0;
              bVar7 = false;
            }
            else {
LAB_0026f074:
              bVar7 = true;
              raw = puVar16;
              if ((uVar8 < 0x10000) && (uVar14 < 0x10000000)) {
                local_50.int_value_ = uVar13 & 0xffffffff | uVar4 << 0x20;
                uVar10 = uVar14 | (uVar10 >> 3) << 0x20 | (uVar10 & 7) << 0x30;
                bVar7 = false;
              }
              else {
                local_50.int_value_ = 0;
                uVar10 = 0;
              }
            }
            break;
          case 1:
            puVar16 = (uint *)(puVar9 + 1);
            if (puVar16 <= puVar17) {
              uVar13 = *puVar9;
              uVar4 = uVar13 >> 0x20;
LAB_0026ef22:
              uVar14 = 0;
              goto LAB_0026f074;
            }
            goto LAB_0026ee35;
          case 2:
            bVar7 = puVar9 >= puVar17;
            uVar4 = uVar3;
            if (puVar9 < puVar17) {
              puVar11 = (ulong *)((long)puVar9 + 1);
              uVar13 = (ulong)((byte)*puVar9 & 0x7f);
              puVar16 = (uint *)puVar11;
              uVar4 = uVar13;
              if ((char)(byte)*puVar9 < '\0') {
                lVar6 = 7;
                puVar12 = puVar11;
                do {
                  bVar7 = 0x38 < lVar6 - 7U || puVar17 <= puVar12;
                  puVar16 = (uint *)puVar11;
                  uVar4 = uVar3;
                  if (bVar7) break;
                  uVar14 = *puVar12;
                  puVar12 = (ulong *)((long)puVar12 + 1);
                  uVar13 = uVar13 | (ulong)((byte)uVar14 & 0x7f) << ((byte)lVar6 & 0x3f);
                  lVar6 = lVar6 + 7;
                  puVar16 = (uint *)puVar12;
                  uVar4 = uVar13;
                } while ((char)(byte)uVar14 < '\0');
              }
            }
            uVar3 = uVar4;
            if (bVar7) {
              puVar16 = (uint *)puVar9;
              uVar3 = 0;
            }
            if (((ulong *)puVar16 == puVar9) || ((ulong)((long)puVar17 - (long)puVar16) < uVar3)) {
              uVar13 = 0;
              uVar4 = 0;
              bVar7 = false;
              uVar14 = 0;
            }
            else {
              uVar4 = (ulong)puVar16 >> 0x20;
              uVar13 = (ulong)puVar16 & 0xffffffff;
              puVar16 = (uint *)((long)puVar16 + uVar3);
              bVar7 = true;
              uVar14 = uVar3;
            }
            if (bVar7) goto LAB_0026f074;
            local_50.int_value_ = 0;
            uVar10 = 0;
            bVar7 = false;
            break;
          default:
            goto switchD_0026eebd_caseD_3;
          case 5:
            puVar16 = (uint *)((long)puVar9 + 4);
            uVar4 = 0;
            if (puVar16 <= puVar17) {
              uVar13 = (ulong)(uint)*puVar9;
              goto LAB_0026ef22;
            }
LAB_0026ee35:
            local_50.int_value_ = 0;
            uVar10 = 0;
            bVar7 = false;
          }
LAB_0026f0bf:
        } while (bVar7);
        local_50.size_ = (uint32_t)uVar10;
        local_50.type_ = (uint8_t)(uVar10 >> 0x30);
        local_50.id_ = (uint16_t)(uVar10 >> 0x20);
      } while( true );
    }
  } while( true );
}

Assistant:

bool EnableTracingRequest::ParseFromArray(const void* raw, size_t size) {
  unknown_fields_.clear();
  bool packed_error = false;

  ::protozero::ProtoDecoder dec(raw, size);
  for (auto field = dec.ReadField(); field.valid(); field = dec.ReadField()) {
    if (field.id() < _has_field_.size()) {
      _has_field_.set(field.id());
    }
    switch (field.id()) {
      case 1 /* trace_config */:
        (*trace_config_).ParseFromArray(field.data(), field.size());
        break;
      case 2 /* attach_notification_only */:
        field.get(&attach_notification_only_);
        break;
      default:
        field.SerializeAndAppendTo(&unknown_fields_);
        break;
    }
  }
  return !packed_error && !dec.bytes_left();
}